

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

cJSON * cJSON_AddObjectToObject(cJSON *object,char *name)

{
  cJSON_bool cVar1;
  cJSON *item;
  cJSON_bool in_R8D;
  
  item = (cJSON *)(*global_hooks.allocate)(0x40);
  if (item != (cJSON *)0x0) {
    item->child = (cJSON *)0x0;
    *(undefined8 *)&item->type = 0;
    item->valuedouble = 0.0;
    item->string = (char *)0x0;
    item->valuestring = (char *)0x0;
    *(undefined8 *)&item->valueint = 0;
    item->next = (cJSON *)0x0;
    item->prev = (cJSON *)0x0;
    item->type = 0x40;
  }
  cVar1 = add_item_to_object(object,name,item,(internal_hooks *)0x0,in_R8D);
  if (cVar1 == 0) {
    cJSON_Delete(item);
    item = (cJSON *)0x0;
  }
  return item;
}

Assistant:

CJSON_PUBLIC(cJSON*) cJSON_AddObjectToObject(cJSON * const object, const char * const name)
{
    cJSON *object_item = cJSON_CreateObject();
    if (add_item_to_object(object, name, object_item, &global_hooks, false))
    {
        return object_item;
    }

    cJSON_Delete(object_item);
    return NULL;
}